

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O1

int try_psk_handshake(ptls_t *tls,size_t *psk_index,int *accept_early_data,
                     st_ptls_client_hello_t *ch,ptls_iovec_t ch_trunc)

{
  uint16_t uVar1;
  st_ptls_get_time_t *psVar2;
  st_ptls_encrypt_ticket_t *psVar3;
  ptls_context_t *ppVar4;
  char *__s2;
  ptls_key_exchange_algorithm_t *ppVar5;
  size_t sVar6;
  ptls_iovec_t ikm;
  int iVar7;
  int iVar8;
  uint64_t uVar9;
  ulong uVar10;
  ulong uVar11;
  ptls_key_exchange_algorithm_t **pppVar12;
  char cVar13;
  uint8_t *puVar14;
  byte bVar15;
  char *__s2_00;
  st_ptls_signature_algorithms_t *psVar16;
  bool bVar17;
  ptls_iovec_t pVar18;
  uint16_t ticket_csid;
  uint16_t ticket_key_exchange_id;
  st_ptls_client_hello_t *local_248;
  anon_struct_168_2_32182ca3_for_identities *local_240;
  int *local_238;
  uint32_t age_add;
  ptls_buffer_t decbuf;
  uint64_t issue_at;
  ptls_iovec_t ticket_psk;
  ptls_iovec_t ticket_negotiated_protocol;
  ptls_iovec_t ticket_server_name;
  uint8_t verify_data [64];
  uint8_t binder_key [64];
  uint8_t decbuf_small [256];
  
  psVar2 = tls->ctx->get_time;
  local_238 = accept_early_data;
  uVar9 = (*psVar2->cb)(psVar2);
  decbuf.base = decbuf_small;
  decbuf.off = 0;
  decbuf.capacity = 0x100;
  decbuf._24_8_ = (ulong)(uint)decbuf._28_4_ << 0x20;
  *psk_index = 0;
  local_248 = ch;
  if ((ch->psk).identities.count != 0) {
    local_240 = &(ch->psk).identities;
    uVar10 = 0;
    __s2_00 = (char *)ch_trunc.len;
    do {
      decbuf.off = 0;
      psVar3 = tls->ctx->encrypt_ticket;
      pVar18.len = local_240->list[uVar10].identity.len;
      pVar18.base = local_240->list[uVar10].identity.base;
      iVar7 = (*psVar3->cb)(psVar3,tls,0,&decbuf,pVar18);
      cVar13 = '\x04';
      if (iVar7 == 0) {
        __s2_00 = (char *)CONCAT71((int7)((ulong)__s2_00 >> 8),1);
LAB_00124431:
        iVar7 = decode_session_identifier
                          (&issue_at,&ticket_psk,&age_add,&ticket_server_name,
                           &ticket_key_exchange_id,&ticket_csid,&ticket_negotiated_protocol,
                           decbuf.base,decbuf.base + decbuf.off);
        sVar6 = ticket_server_name.len;
        if (((iVar7 != 0) || (uVar9 < issue_at)) ||
           (ppVar4 = tls->ctx, (ulong)ppVar4->ticket_lifetime * 1000 < uVar9 - issue_at))
        goto LAB_0012449d;
        *local_238 = 0;
        bVar15 = (byte)__s2_00 ^ 1 | (local_248->psk).early_data_indication == 0;
        __s2_00 = (char *)CONCAT71((int7)((ulong)__s2_00 >> 8),bVar15);
        if (bVar15 == 0) {
          uVar11 = uVar9 - (issue_at + (local_240->list[uVar10].obfuscated_ticket_age - age_add));
          uVar10 = -uVar11;
          if (0 < (long)uVar11) {
            uVar10 = uVar11;
          }
          if (uVar10 < 0x2711) {
            *local_238 = 1;
          }
        }
        if (ticket_server_name.len == 0) {
          if (tls->server_name == (char *)0x0) {
LAB_00124587:
            sVar6 = ticket_negotiated_protocol.len;
            pppVar12 = ppVar4->key_exchanges;
            ppVar5 = *pppVar12;
            cVar13 = '\x04';
            bVar17 = ppVar5 == (ptls_key_exchange_algorithm_t *)0x0;
            if (!bVar17) {
              uVar1 = ppVar5->id;
              while (uVar1 != ticket_key_exchange_id) {
                pppVar12 = pppVar12 + 1;
                ppVar5 = *pppVar12;
                bVar17 = ppVar5 == (ptls_key_exchange_algorithm_t *)0x0;
                if (bVar17) goto LAB_001245ca;
                uVar1 = ppVar5->id;
              }
              if (!bVar17) {
                tls->key_share = ppVar5;
                cVar13 = '\0';
              }
            }
LAB_001245ca:
            if ((!bVar17) && (cVar13 = '\x04', ticket_csid == tls->cipher_suite->id)) {
              if ((ticket_negotiated_protocol.len != 0) &&
                 (((__s2_00 = tls->negotiated_protocol, __s2_00 == (char *)0x0 ||
                   (iVar7 = strncmp((char *)ticket_negotiated_protocol.base,__s2_00,
                                    ticket_negotiated_protocol.len), iVar7 != 0)) ||
                  (__s2_00[sVar6] != '\0')))) goto LAB_0012449d;
              sVar6 = (tls->key_schedule->hashes[0].algo)->digest_size;
              if (ticket_psk.len == sVar6) {
                cVar13 = (local_240->list[*psk_index].binder.len == sVar6) * '\x05' + '\x04';
              }
            }
          }
        }
        else {
          __s2 = tls->server_name;
          if ((__s2 == (char *)0x0) ||
             (iVar7 = strncmp((char *)ticket_server_name.base,__s2,ticket_server_name.len),
             __s2_00 = __s2, iVar7 != 0)) goto LAB_0012449d;
          if (__s2[sVar6] == '\0') goto LAB_00124587;
        }
      }
      else {
        if (iVar7 == 0x209) {
          __s2_00 = (char *)0x0;
          goto LAB_00124431;
        }
LAB_0012449d:
        cVar13 = '\x04';
      }
      if (cVar13 != '\x04') {
        if (cVar13 != '\t') {
          return (int)__s2_00;
        }
        ikm.len = ticket_psk.len;
        ikm.base = ticket_psk.base;
        iVar7 = key_schedule_extract(tls->key_schedule,ikm);
        if ((iVar7 == 0) &&
           (iVar7 = derive_secret(tls->key_schedule,binder_key,"res binder"), iVar7 == 0)) {
          local_248 = (st_ptls_client_hello_t *)tls->key_schedule;
          if ((local_248->key_shares).base != (uint8_t *)0x0) {
            psVar16 = &local_248->signature_algorithms;
            puVar14 = (uint8_t *)0x0;
            do {
              (*(code *)**(undefined8 **)psVar16->list)
                        (*(undefined8 **)psVar16->list,ch_trunc.base,(char *)ch_trunc.len);
              puVar14 = puVar14 + 1;
              psVar16 = (st_ptls_signature_algorithms_t *)(psVar16->list + 8);
            } while (puVar14 != (local_248->key_shares).base);
          }
          iVar7 = calc_verify_data(verify_data,tls->key_schedule,binder_key);
          if (iVar7 == 0) {
            iVar8 = (*ptls_mem_equal)(local_240->list[*psk_index].binder.base,verify_data,
                                      (tls->key_schedule->hashes[0].algo)->digest_size);
            iVar7 = 0x33;
            if (iVar8 != 0) {
              iVar7 = 0;
            }
          }
        }
        goto LAB_0012472c;
      }
      uVar10 = *psk_index + 1;
      *psk_index = uVar10;
    } while (uVar10 < (local_248->psk).identities.count);
  }
  *psk_index = 0xffffffffffffffff;
  *local_238 = 0;
  tls->key_share = (ptls_key_exchange_algorithm_t *)0x0;
  iVar7 = 0;
LAB_0012472c:
  (*ptls_clear_memory)(decbuf.base,decbuf.off);
  if (decbuf.is_allocated != 0) {
    free(decbuf.base);
  }
  decbuf.off = 0;
  decbuf.is_allocated = 0;
  decbuf._28_4_ = 0;
  decbuf.base = (uint8_t *)0x0;
  decbuf.capacity = 0;
  (*ptls_clear_memory)(binder_key,0x40);
  (*ptls_clear_memory)(verify_data,0x40);
  return iVar7;
}

Assistant:

static int try_psk_handshake(ptls_t *tls, size_t *psk_index, int *accept_early_data, struct st_ptls_client_hello_t *ch,
                             ptls_iovec_t ch_trunc)
{
    ptls_buffer_t decbuf;
    ptls_iovec_t ticket_psk, ticket_server_name, ticket_negotiated_protocol;
    uint64_t issue_at, now = tls->ctx->get_time->cb(tls->ctx->get_time);
    uint32_t age_add;
    uint16_t ticket_key_exchange_id, ticket_csid;
    uint8_t decbuf_small[256], binder_key[PTLS_MAX_DIGEST_SIZE], verify_data[PTLS_MAX_DIGEST_SIZE];
    int ret;

    ptls_buffer_init(&decbuf, decbuf_small, sizeof(decbuf_small));

    for (*psk_index = 0; *psk_index < ch->psk.identities.count; ++*psk_index) {
        struct st_ptls_client_hello_psk_t *identity = ch->psk.identities.list + *psk_index;
        /* decrypt and decode */
        int can_accept_early_data = 1;
        decbuf.off = 0;
        switch (tls->ctx->encrypt_ticket->cb(tls->ctx->encrypt_ticket, tls, 0, &decbuf, identity->identity)) {
        case 0: /* decrypted */
            break;
        case PTLS_ERROR_REJECT_EARLY_DATA: /* decrypted, but early data is rejected */
            can_accept_early_data = 0;
            break;
        default: /* decryption failure */
            continue;
        }
        if (decode_session_identifier(&issue_at, &ticket_psk, &age_add, &ticket_server_name, &ticket_key_exchange_id, &ticket_csid,
                                      &ticket_negotiated_protocol, decbuf.base, decbuf.base + decbuf.off) != 0)
            continue;
        /* check age */
        if (now < issue_at)
            continue;
        if (now - issue_at > (uint64_t)tls->ctx->ticket_lifetime * 1000)
            continue;
        *accept_early_data = 0;
        if (ch->psk.early_data_indication && can_accept_early_data) {
            /* accept early-data if abs(diff) between the reported age and the actual age is within += 10 seconds */
            int64_t delta = (now - issue_at) - (identity->obfuscated_ticket_age - age_add);
            if (delta < 0)
                delta = -delta;
            if (delta <= PTLS_EARLY_DATA_MAX_DELAY)
                *accept_early_data = 1;
        }
        /* check server-name */
        if (ticket_server_name.len != 0) {
            if (tls->server_name == NULL)
                continue;
            if (!vec_is_string(ticket_server_name, tls->server_name))
                continue;
        } else {
            if (tls->server_name != NULL)
                continue;
        }
        { /* check key-exchange */
            ptls_key_exchange_algorithm_t **a;
            for (a = tls->ctx->key_exchanges; *a != NULL && (*a)->id != ticket_key_exchange_id; ++a)
                ;
            if (*a == NULL)
                continue;
            tls->key_share = *a;
        }
        /* check cipher-suite */
        if (ticket_csid != tls->cipher_suite->id)
            continue;
        /* check negotiated-protocol */
        if (ticket_negotiated_protocol.len != 0) {
            if (tls->negotiated_protocol == NULL)
                continue;
            if (!vec_is_string(ticket_negotiated_protocol, tls->negotiated_protocol))
                continue;
        }
        /* check the length of the decrypted psk and the PSK binder */
        if (ticket_psk.len != tls->key_schedule->hashes[0].algo->digest_size)
            continue;
        if (ch->psk.identities.list[*psk_index].binder.len != tls->key_schedule->hashes[0].algo->digest_size)
            continue;

        /* found */
        goto Found;
    }

    /* not found */
    *psk_index = SIZE_MAX;
    *accept_early_data = 0;
    tls->key_share = NULL;
    ret = 0;
    goto Exit;

Found:
    if ((ret = key_schedule_extract(tls->key_schedule, ticket_psk)) != 0)
        goto Exit;
    if ((ret = derive_secret(tls->key_schedule, binder_key, "res binder")) != 0)
        goto Exit;
    ptls__key_schedule_update_hash(tls->key_schedule, ch_trunc.base, ch_trunc.len);
    if ((ret = calc_verify_data(verify_data, tls->key_schedule, binder_key)) != 0)
        goto Exit;
    if (!ptls_mem_equal(ch->psk.identities.list[*psk_index].binder.base, verify_data,
                        tls->key_schedule->hashes[0].algo->digest_size)) {
        ret = PTLS_ALERT_DECRYPT_ERROR;
        goto Exit;
    }
    ret = 0;

Exit:
    ptls_buffer_dispose(&decbuf);
    ptls_clear_memory(binder_key, sizeof(binder_key));
    ptls_clear_memory(verify_data, sizeof(verify_data));
    return ret;
}